

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::WriteObject(ON_BinaryArchive *this,ON_Object *model_object)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ON_Extrusion *this_00;
  undefined4 extraout_var;
  ON_SumSurface *model_object_00;
  ON_NurbsSurface *pOVar4;
  ON_Annotation *V6_annotation;
  ON_TextDot *this_01;
  wchar_t *s;
  ON_NurbsCurve *pOVar5;
  ON_OBSOLETE_V5_Annotation *V5_annotation;
  uint unaff_EBP;
  uint uVar6;
  ON_NurbsSurface nurbs_surface;
  undefined1 local_a0 [24];
  int aiStack_88 [2];
  int local_80 [2];
  ON_wString local_78 [6];
  double local_48;
  int aiStack_40 [2];
  int local_38 [2];
  
  bVar2 = (byte)unaff_EBP;
  if (this->m_3dm_version - 1U < 0x32) {
    iVar3 = (*model_object->_vptr_ON_Object[0xc])(model_object);
    if (iVar3 < 0x200) {
      if (iVar3 == 4) {
        if (this->m_3dm_version < 3) {
          pOVar5 = ON_NurbsCurve::Cast(model_object);
          if (pOVar5 != (ON_NurbsCurve *)0x0) goto LAB_00398968;
          ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_a0);
          uVar6 = 0;
          iVar3 = (*model_object->_vptr_ON_Object[0x3f])(0,model_object,(ON_NurbsCurve *)local_a0,0)
          ;
          if ((iVar3 != 0) && (iVar3 = ON_NurbsCurve::Order((ON_NurbsCurve *)local_a0), 1 < iVar3))
          {
            unaff_EBP = ON_NurbsCurve::CVCount((ON_NurbsCurve *)local_a0);
            iVar3 = ON_NurbsCurve::Order((ON_NurbsCurve *)local_a0);
            if ((iVar3 <= (int)unaff_EBP) &&
               (iVar3 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)local_a0), uVar6 = 0, 0 < iVar3))
            {
              bVar1 = Internal_WriteObject(this,(ON_Object *)local_a0);
              unaff_EBP = (uint)bVar1;
              uVar6 = 1;
            }
          }
          bVar2 = (byte)unaff_EBP;
          ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_a0);
          goto LAB_0039896e;
        }
        goto LAB_00398974;
      }
      if ((iVar3 != 8) || (2 < this->m_3dm_version)) goto LAB_00398974;
      pOVar4 = ON_NurbsSurface::Cast(model_object);
      if (pOVar4 == (ON_NurbsSurface *)0x0) {
        ON_NurbsSurface::ON_NurbsSurface((ON_NurbsSurface *)local_a0);
        iVar3 = (*model_object->_vptr_ON_Object[0x3c])(0,model_object);
        if (iVar3 == 0) {
          uVar6 = 0;
        }
        else {
          iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)local_a0,0);
          uVar6 = 0;
          if ((1 < iVar3) &&
             (iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)local_a0,1), 1 < iVar3)) {
            unaff_EBP = ON_NurbsSurface::CVCount((ON_NurbsSurface *)local_a0,0);
            iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)local_a0,0);
            uVar6 = 0;
            if (iVar3 <= (int)unaff_EBP) {
              unaff_EBP = ON_NurbsSurface::CVCount((ON_NurbsSurface *)local_a0,1);
              iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)local_a0,1);
              uVar6 = 0;
              if ((iVar3 <= (int)unaff_EBP) &&
                 (iVar3 = ON_NurbsSurface::Dimension((ON_NurbsSurface *)local_a0), 0 < iVar3)) {
                bVar1 = Internal_WriteObject(this,(ON_Object *)local_a0);
                unaff_EBP = (uint)bVar1;
                uVar6 = 1;
              }
            }
          }
        }
        bVar2 = (byte)unaff_EBP;
        ON_NurbsSurface::~ON_NurbsSurface((ON_NurbsSurface *)local_a0);
      }
      else {
LAB_00398968:
        uVar6 = 2;
      }
LAB_0039896e:
      if ((uVar6 & 1) == 0) goto LAB_00398974;
    }
    else {
      if (iVar3 == 0x200) {
        V6_annotation = ON_Annotation::Cast(model_object);
        if (V6_annotation == (ON_Annotation *)0x0) {
          if (2 < this->m_3dm_version) goto LAB_00398968;
          V5_annotation = ON_OBSOLETE_V5_Annotation::Cast(model_object);
          if (V5_annotation == (ON_OBSOLETE_V5_Annotation *)0x0) {
            uVar6 = 0;
            goto LAB_0039896e;
          }
          bVar2 = Internal_WriteV2AnnotationObject
                            (this,V5_annotation,(ON_3dmAnnotationContext *)0x0);
        }
        else {
          bVar2 = Internal_WriteV5AnnotationObject
                            (this,V6_annotation,(ON_3dmAnnotationContext *)0x0);
        }
        uVar6 = 1;
        goto LAB_0039896e;
      }
      if (iVar3 == 0x2000) {
        if (this->m_3dm_version < 3) {
          this_01 = ON_TextDot::Cast(model_object);
          if (this_01 != (ON_TextDot *)0x0) {
            ON_OBSOLETE_V2_TextDot::ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)local_a0);
            ON_TextDot::CenterPoint(this_01);
            local_80[0] = local_38[0];
            local_80[1] = local_38[1];
            local_a0._16_8_ = local_48;
            aiStack_88[0] = aiStack_40[0];
            aiStack_88[1] = aiStack_40[1];
            s = ON_TextDot::PrimaryText(this_01);
            ON_wString::operator=(local_78,s);
            bVar2 = Internal_WriteObject(this,(ON_Object *)local_a0);
            ON_OBSOLETE_V2_TextDot::~ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)local_a0);
          }
          uVar6 = 1;
          if (this_01 != (ON_TextDot *)0x0) goto LAB_00398977;
        }
      }
      else if ((iVar3 == 0x40000000) && (this->m_3dm_version < 5)) {
        this_00 = ON_Extrusion::Cast(model_object);
        bVar1 = true;
        if (this_00 != (ON_Extrusion *)0x0) {
          iVar3 = ON_Extrusion::IsCapped(this_00);
          if ((iVar3 == 0) && (iVar3 = ON_Extrusion::ProfileCount(this_00), iVar3 < 2)) {
            model_object_00 = (ON_SumSurface *)0x0;
          }
          else {
            iVar3 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                      [0x21])(this_00);
            model_object_00 = (ON_SumSurface *)CONCAT44(extraout_var,iVar3);
          }
          if (model_object_00 == (ON_SumSurface *)0x0) {
            if (this->m_3dm_version < 4) {
              model_object_00 = (ON_SumSurface *)0x0;
            }
            else {
              model_object_00 = ON_Extrusion::SumSurfaceForm(this_00,(ON_SumSurface *)0x0);
            }
            if (model_object_00 == (ON_SumSurface *)0x0) {
              model_object_00 =
                   (ON_SumSurface *)
                   ON_Surface::NurbsSurface
                             (&this_00->super_ON_Surface,(ON_NurbsSurface *)0x0,0.0,
                              (ON_Interval *)0x0,(ON_Interval *)0x0);
            }
            if (model_object_00 == (ON_SumSurface *)0x0) goto LAB_00398a2f;
          }
          bVar2 = Internal_WriteObject(this,(ON_Object *)model_object_00);
          (*(model_object_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4]
          )(model_object_00);
          bVar1 = false;
        }
LAB_00398a2f:
        uVar6 = 1;
        if (!bVar1) goto LAB_00398977;
      }
LAB_00398974:
      uVar6 = 0;
    }
LAB_00398977:
    if (uVar6 != 0) goto LAB_00398989;
  }
  bVar2 = Internal_WriteObject(this,model_object);
LAB_00398989:
  return (bool)(bVar2 & 1);
}

Assistant:

bool
ON_BinaryArchive::WriteObject( const ON_Object& model_object )
{
  // writes polymorphic object derived from ON_Object in a way that
  // it can be recreated from ON_BinaryArchive::ReadObject

  if ( m_3dm_version >= 1 && m_3dm_version <= 50 )
  {
    const ON::object_type model_object_type = model_object.ObjectType();
    switch (model_object_type)
    {
    case ON::object_type::curve_object:
      {
        if (m_3dm_version > 2)
          break;
        const ON_Curve* curve = static_cast<const ON_Curve*>(&model_object);
        if (nullptr == curve)
          break;
        if (nullptr != ON_NurbsCurve::Cast(curve))
          break;
        ON_NurbsCurve nurbs_curve;
        if (curve->GetNurbForm(nurbs_curve)
          && nurbs_curve.Order() >= 2
          && nurbs_curve.CVCount() >= nurbs_curve.Order()
          && nurbs_curve.Dimension() >= 1
          )
        {
          return Internal_WriteObject(nurbs_curve);
        }
      }
      break;

    case ON::object_type::surface_object:
      {
        if (m_3dm_version > 2)
          break;
        const ON_Surface* surface = static_cast<const ON_Surface*>(&model_object);
        if (nullptr == surface)
          break;
        if (nullptr != ON_NurbsSurface::Cast(surface))
          break;
        ON_NurbsSurface nurbs_surface;
        if (surface->GetNurbForm(nurbs_surface)
          && nurbs_surface.Order(0) >= 2
          && nurbs_surface.Order(1) >= 2
          && nurbs_surface.CVCount(0) >= nurbs_surface.Order(0)
          && nurbs_surface.CVCount(1) >= nurbs_surface.Order(1)
          && nurbs_surface.Dimension() >= 1
          )
        {
          return Internal_WriteObject(nurbs_surface);
        }
      }
      break;

    case ON::extrusion_object:
      {
        if (m_3dm_version > 4)
          break;
        // 29 September 2010 Dale Lear
        //   ON_Extrusion was added in V5.  It must be translated
        //   to a brep or surface to save it in a V4 file.
        const ON_Extrusion* extrusion = ON_Extrusion::Cast(&model_object);
        if (nullptr == extrusion)
          break;
        ON_Object* V4_object = nullptr;
        if (extrusion->IsCapped() || extrusion->ProfileCount() >= 2)
          V4_object = extrusion->BrepForm(0);
        if (nullptr == V4_object)
        {
          if (m_3dm_version >= 4)
            V4_object = extrusion->SumSurfaceForm(0);
          if (nullptr == V4_object)
            V4_object = extrusion->NurbsSurface(0);
          if (nullptr == V4_object)
            break;
        }
        const bool rc = Internal_WriteObject(*V4_object);
        delete V4_object;
        return rc;
      }
      break;

    case ON::annotation_object:
      {
        const ON_Annotation* V6_annotation = ON_Annotation::Cast(&model_object);
        if (nullptr != V6_annotation)
          return Internal_WriteV5AnnotationObject(*V6_annotation, nullptr);
        if (m_3dm_version > 2)
          break;

        const ON_OBSOLETE_V5_Annotation* V5_annotation = ON_OBSOLETE_V5_Annotation::Cast(&model_object);
        if (nullptr != V5_annotation)
          return Internal_WriteV2AnnotationObject(*V5_annotation, nullptr);
      }
      break;

    case ON::object_type::text_dot:
      {
        if (m_3dm_version > 2)
          break;
        const ON_TextDot* text_dot = ON_TextDot::Cast(&model_object);
        if (nullptr == text_dot)
          break;
        ON_OBSOLETE_V2_TextDot V2_text_dot;
        V2_text_dot.point = text_dot->CenterPoint();
        V2_text_dot.m_text = text_dot->PrimaryText();
        return Internal_WriteObject(V2_text_dot);
      }
      break;
    default:
      break;
    }
  }
  
  return Internal_WriteObject(model_object);
}